

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O2

osfildef * osfdup(osfildef *orig,char *mode)

{
  char cVar1;
  int iVar2;
  void *pvVar3;
  FILE *pFVar4;
  undefined1 *puVar5;
  char *pcVar6;
  undefined1 local_2a;
  undefined1 local_29;
  
  pcVar6 = mode;
  while (*pcVar6 != '\0') {
    pvVar3 = memchr("rw+bst",(int)*pcVar6,7);
    pcVar6 = pcVar6 + 1;
    if (pvVar3 == (void *)0x0) {
      return (osfildef *)0x0;
    }
  }
  cVar1 = *mode;
  if ((cVar1 != 'w') && (cVar1 != 'r')) {
    return (osfildef *)0x0;
  }
  if (mode[1] == '+') {
    puVar5 = &local_2a;
  }
  else {
    puVar5 = &local_29;
    if ((cVar1 != 'w') && (cVar1 != 'r')) {
      return (osfildef *)0x0;
    }
  }
  *puVar5 = 0;
  iVar2 = fileno((FILE *)orig);
  iVar2 = dup(iVar2);
  pFVar4 = fdopen(iVar2,mode);
  return (osfildef *)pFVar4;
}

Assistant:

osfildef*
osfdup(osfildef *orig, const char *mode)
{
    char realmode[5];
    char *p = realmode;
    const char *m;

    /* verify that there aren't any unrecognized mode flags */
    for (m = mode ; *m != '\0' ; ++m)
    {
        if (strchr("rw+bst", *m) == 0)
            return 0;
    }

    /* figure the read/write mode - translate r+ and w+ to r+ */
    if ((mode[0] == 'r' || mode[0] == 'w') && mode[1] == '+')
        *p++ = 'r', *p++ = '+';
    else if (mode[0] == 'r')
        *p++ = 'r';
    else if (mode[0] == 'w')
        *p++ = 'w';
    else
        return 0;

    /* end the mode string */
    *p = '\0';

    /* duplicate the handle in the given mode */
    return fdopen(dup(fileno(orig)), mode);
}